

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

int uarb_set(uarb result,png_alloc_size_t val)

{
  int local_1c;
  png_alloc_size_t pStack_18;
  int ndigits;
  png_alloc_size_t val_local;
  uarb result_local;
  
  local_1c = 0;
  for (pStack_18 = val; pStack_18 != 0; pStack_18 = pStack_18 >> 0x10) {
    result[local_1c] = (png_uint_16)pStack_18;
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

static int
uarb_set(uarb result, png_alloc_size_t val)
   /* Set (initialize) 'result' to 'val'.  The size required for 'result' must
    * be determined by the caller from a knowledge of the maximum for 'val'.
    */
{
   int ndigits = 0;

   while (val > 0)
   {
      result[ndigits++] = (png_uint_16)(val & 0xffff);
      val >>= 16;
   }

   return ndigits;
}